

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t),false,true>
               (string_t *ldata,string_t *rdata,string_t *result_data,idx_t count,ValidityMask *mask
               ,_func_string_t_string_t_string_t *fun)

{
  unsigned_long *puVar1;
  anon_struct_16_3_d7536bce_for_pointer aVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  ulong uVar9;
  string_t sVar10;
  string_t sVar11;
  string_t sVar12;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      aVar2 = (rdata->value).pointer;
      lVar5 = 8;
      do {
        sVar10.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar5);
        sVar10.value._0_8_ = *(undefined8 *)((long)ldata + lVar5 + -8);
        sVar10 = (*fun)(sVar10,(string_t)aVar2);
        *(long *)((long)result_data + lVar5 + -8) = sVar10.value._0_8_;
        *(long *)((long)&result_data->value + lVar5) = sVar10.value._8_8_;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar1[uVar3];
      }
      uVar4 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar4 = count;
      }
      uVar6 = uVar4;
      if (uVar7 != 0) {
        uVar6 = uVar8;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar8 < uVar4) {
            aVar2 = (rdata->value).pointer;
            uVar8 = uVar8 << 4 | 8;
            do {
              sVar11.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar8);
              sVar11.value._0_8_ = *(undefined8 *)((long)ldata + (uVar8 - 8));
              sVar10 = (*fun)(sVar11,(string_t)aVar2);
              *(long *)((long)result_data + (uVar8 - 8)) = sVar10.value._0_8_;
              *(long *)((long)&result_data->value + uVar8) = sVar10.value._8_8_;
              uVar6 = uVar6 + 1;
              uVar8 = uVar8 + 0x10;
            } while (uVar4 != uVar6);
          }
        }
        else if (uVar8 < uVar4) {
          uVar6 = uVar8 << 4 | 8;
          uVar9 = 0;
          do {
            if ((uVar7 >> (uVar9 & 0x3f) & 1) != 0) {
              sVar12.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar6);
              sVar12.value._0_8_ = *(undefined8 *)((long)ldata + (uVar6 - 8));
              sVar10 = (*fun)(sVar12,(string_t)(rdata->value).pointer);
              *(long *)((long)result_data + (uVar6 - 8)) = sVar10.value._0_8_;
              *(long *)((long)&result_data->value + uVar6) = sVar10.value._8_8_;
            }
            uVar9 = uVar9 + 1;
            uVar6 = uVar6 + 0x10;
          } while ((uVar8 - uVar4) + uVar9 != 0);
          uVar6 = uVar8 + uVar9;
        }
      }
      uVar3 = uVar3 + 1;
      uVar8 = uVar6;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}